

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_pain_message(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar4 = 0;
    do {
      if (*(long *)((long)pvVar2 + uVar4 * 8) == 0) goto LAB_0017247e;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 7);
    uVar4 = 7;
LAB_0017247e:
    pVar1 = PARSE_ERROR_TOO_MANY_ENTRIES;
    if ((int)uVar4 != 7) {
      pcVar3 = parser_getstr(p,"message");
      pcVar3 = string_make(pcVar3);
      *(char **)((long)pvVar2 + (uVar4 & 0xffffffff) * 8) = pcVar3;
      pVar1 = PARSE_ERROR_NONE;
    }
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_pain_message(struct parser *p) {
	struct monster_pain *mp = parser_priv(p);
	int i;

	if (!mp)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	for (i = 0; i < 7; i++)
		if (!mp->messages[i])
			break;
	if (i == 7)
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	mp->messages[i] = string_make(parser_getstr(p, "message"));
	return PARSE_ERROR_NONE;
}